

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker3F1S.cpp
# Opt level: O2

void __thiscall WorkerCallback::WorkerCallback(WorkerCallback *this,string *output)

{
  bool bVar1;
  FILE *pFVar2;
  
  (this->super_Callback)._vptr_Callback = (_func_int **)&PTR_on_start_0010ccd0;
  bVar1 = std::operator==(output,"stdout");
  pFVar2 = _stdout;
  if (!bVar1) {
    bVar1 = std::operator==(output,"null");
    if (bVar1) {
      pFVar2 = (FILE *)0x0;
    }
    else {
      pFVar2 = fopen((output->_M_dataplus)._M_p,"w");
    }
  }
  this->m_output = (FILE *)pFVar2;
  return;
}

Assistant:

WorkerCallback(std::string output)
    {
        if (output == "stdout") {
            m_output = stdout;
        } else if (output == "null") {
            m_output = NULL;
        } else {
            m_output = fopen(output.c_str(), "w");
        }
    }